

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

bool __thiscall
QAbstractItemViewPrivate::sendDelegateEvent
          (QAbstractItemViewPrivate *this,QModelIndex *index,QEvent *event)

{
  QAbstractItemView *this_00;
  undefined1 uVar1;
  uint uVar2;
  long *plVar3;
  long in_FS_OFFSET;
  QModelIndex local_140;
  int local_128;
  int iStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  QAbstractItemModel *local_118;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemView **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  local_118 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_128 = -0x55555556;
  iStack_124 = -0x55555556;
  uStack_120 = 0xaaaaaaaa;
  uStack_11c = 0xaaaaaaaa;
  (**(code **)(*(long *)this->model + 0x148))(&local_128,this->model,index);
  memset(&local_108,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
  (**(code **)(*(long *)this_00 + 0x2f8))(this_00,&local_108);
  local_108.super_QStyleOption.rect =
       (QRect)(**(code **)(*(long *)this_00 + 0x1e0))(this_00,&local_128);
  QAbstractItemView::currentIndex(&local_140,this_00);
  uVar2 = 0;
  if (((local_128 == local_140.r) && (uVar2 = 0, iStack_124 == local_140.c)) &&
     (CONCAT44(uStack_11c,uStack_120) == local_140.i)) {
    uVar2 = (uint)(local_118 == local_140.m.ptr) << 8;
  }
  local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorageHelper<QStyle::StateFlag,_4>)
       ((uint)local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
              super_QFlagsStorage<QStyle::StateFlag>.i | uVar2);
  plVar3 = (long *)(**(code **)(*(long *)this_00 + 0x208))(this_00,index);
  if (plVar3 == (long *)0x0 || event == (QEvent *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = (**(code **)(*plVar3 + 0x98))(plVar3,event,this->model,&local_108,&local_128);
  }
  QStyleOptionViewItem::~QStyleOptionViewItem(&local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QAbstractItemViewPrivate::sendDelegateEvent(const QModelIndex &index, QEvent *event) const
{
    Q_Q(const QAbstractItemView);
    QModelIndex buddy = model->buddy(index);
    QStyleOptionViewItem options;
    q->initViewItemOption(&options);
    options.rect = q->visualRect(buddy);
    options.state |= (buddy == q->currentIndex() ? QStyle::State_HasFocus : QStyle::State_None);
    QAbstractItemDelegate *delegate = q->itemDelegateForIndex(index);
    return (event && delegate && delegate->editorEvent(event, model, options, buddy));
}